

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

bool __thiscall libtorrent::aux::torrent::should_announce_dht(torrent *this)

{
  uint uVar1;
  element_type *peVar2;
  node_ptr plVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  unique_lock<std::mutex> local_30;
  
  if (((this->field_0x5cc & 0x20) != 0) &&
     (iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x45])(), (char)iVar5 != '\0')) {
    if ((char)this->field_0x5cc < '\0') {
      iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x2e])();
      local_30._M_device = (mutex_type *)(CONCAT44(extraout_var,iVar5) + 0x438);
      local_30._M_owns = false;
      ::std::unique_lock<std::mutex>::lock(&local_30);
      local_30._M_owns = true;
      uVar1 = *(uint *)(CONCAT44(extraout_var,iVar5) + 0x428);
      ::std::unique_lock<std::mutex>::~unique_lock(&local_30);
      if ((uVar1 >> 0x17 & 1) == 0) {
        return false;
      }
    }
    iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x49])();
    if (CONCAT44(extraout_var_00,iVar5) != 0) {
      peVar2 = (this->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar5 = (peVar2->m_files).m_piece_length;
      if ((((iVar5 < 1) || ((this->field_0x5c0 & 8) != 0)) && ((this->field_0x5e0 & 1) != 0)) &&
         ((((this->super_torrent_hot_members).field_0x4b & 8) == 0 &&
          ((iVar5 < 1 || (((peVar2->m_flags).m_val & 2) == 0)))))) {
        plVar3 = (this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header.super_node.
                 next_;
        if (plVar3 == &(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header.
                       super_node || plVar3 == (node_ptr)0x0) {
          return true;
        }
        iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[0x2e])();
        bVar4 = session_settings::get_bool
                          ((session_settings *)CONCAT44(extraout_var_01,iVar5),0x8004);
        if (bVar4) {
          bVar4 = tracker_list::any_verified(&this->m_trackers);
          return !bVar4;
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool torrent::should_announce_dht() const
	{
		TORRENT_ASSERT(is_single_thread());
		if (!m_enable_dht) return false;
		if (!m_ses.announce_dht()) return false;

#if TORRENT_USE_I2P
		// i2p torrents don't announced on the DHT
		// unless we allow mixed swarms
		if (is_i2p() && !settings().get_bool(settings_pack::allow_i2p_mixed))
			return false;
#endif

		if (!m_ses.dht()) return false;
		if (m_torrent_file->is_valid() && !m_files_checked) return false;
		if (!m_announce_to_dht) return false;
		if (m_paused) return false;

		// don't announce private torrents
		if (m_torrent_file->is_valid() && m_torrent_file->priv()) return false;
		if (m_trackers.empty()) return true;
		if (!settings().get_bool(settings_pack::use_dht_as_fallback)) return true;

		return !m_trackers.any_verified();
	}